

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O2

Utest * __thiscall
TEST_DoublingFactorCounterTest_NoPointsHand_ScoringWindPair_TestShell::createTest
          (TEST_DoublingFactorCounterTest_NoPointsHand_ScoringWindPair_TestShell *this)

{
  TEST_DoublingFactorCounterTest_NoPointsHand_ScoringWindPair_Test *this_00;
  
  this_00 = (TEST_DoublingFactorCounterTest_NoPointsHand_ScoringWindPair_Test *)
            operator_new(0xc0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                         ,0xa6);
  TEST_DoublingFactorCounterTest_NoPointsHand_ScoringWindPair_Test::
  TEST_DoublingFactorCounterTest_NoPointsHand_ScoringWindPair_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(DoublingFactorCounterTest, NoPointsHand_ScoringWindPair)
{
	s.setRoundWind(Tile::EastWind);

	addPair(Tile::EastWind);
	addSequence(Tile::OneOfCharacters, false);
	addSequence(Tile::TwoOfCircles, false);
	addSequence(Tile::TwoOfBamboos, false);
	addSequence(Tile::SevenOfCharacters, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(0, r.patterns.count(Pattern::NoPointsHand));
}